

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O0

void secp256k1_scratch_destroy(secp256k1_callback *error_callback,secp256k1_scratch *scratch)

{
  int iVar1;
  secp256k1_scratch *scratch_local;
  secp256k1_callback *error_callback_local;
  
  if (scratch != (secp256k1_scratch *)0x0) {
    iVar1 = secp256k1_memcmp_var(scratch,"scratch",8);
    if (iVar1 == 0) {
      memset(scratch,0,8);
      free(scratch);
    }
    else {
      secp256k1_callback_call(error_callback,"invalid scratch space");
    }
  }
  return;
}

Assistant:

static void secp256k1_scratch_destroy(const secp256k1_callback* error_callback, secp256k1_scratch* scratch) {
    if (scratch != NULL) {
        VERIFY_CHECK(scratch->alloc_size == 0); /* all checkpoints should be applied */
        if (secp256k1_memcmp_var(scratch->magic, "scratch", 8) != 0) {
            secp256k1_callback_call(error_callback, "invalid scratch space");
            return;
        }
        memset(scratch->magic, 0, sizeof(scratch->magic));
        free(scratch);
    }
}